

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

double * __thiscall
TPZSkylMatrix<double>::operator()(TPZSkylMatrix<double> *this,int64_t r,int64_t c)

{
  TPZSkylMatrix<double> *this_00;
  int64_t iVar1;
  double **ppdVar2;
  long in_RDX;
  long in_RSI;
  int64_t in_RDI;
  int64_t index;
  int64_t col;
  int64_t row;
  char *in_stack_000001b8;
  char *in_stack_000001c0;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  TPZSkylMatrix<double> *pTVar3;
  long local_28;
  long local_20 [4];
  
  local_28 = in_RDX;
  local_20[0] = in_RSI;
  if (in_RDX < in_RSI) {
    TPZMatrix<double>::Swap(local_20,&local_28);
  }
  this_00 = (TPZSkylMatrix<double> *)(local_28 - local_20[0]);
  pTVar3 = this_00;
  iVar1 = Size(this_00,in_RDI);
  if (iVar1 <= (long)this_00) {
    TPZMatrix<double>::Error(in_stack_000001c0,in_stack_000001b8);
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  ppdVar2 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 0x20),local_28);
  return *ppdVar2 + (long)pTVar3;
}

Assistant:

TVar &
TPZSkylMatrix<TVar>::operator()(const int64_t r, const int64_t c) {
	int64_t row(r),col(c);
	if ( row > col ) this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	if ( index >= Size(col) ) {
		//Error("TPZSkylMatrix::operator()","Index out of range");
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
		DebugStop();
	}
	return fElem[col][index];
}